

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O2

ze_result_t
validation_layer::zeDeviceGet
          (ze_driver_handle_t hDriver,uint32_t *pCount,ze_device_handle_t *phDevices)

{
  Logger *this;
  long *plVar1;
  ze_result_t result;
  ze_result_t zVar2;
  long lVar3;
  ulong uVar4;
  size_t i;
  long lVar5;
  long lVar6;
  allocator local_59;
  code *local_58;
  string local_50;
  
  lVar6 = context;
  this = *(Logger **)(context + 0xd50);
  std::__cxx11::string::string
            ((string *)&local_50,"zeDeviceGet(hDriver, pCount, phDevices)",&local_59);
  loader::Logger::log_trace(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (*(code **)(lVar6 + 0xe8) == (code *)0x0) {
    result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar3 = *(long *)(lVar6 + 0xd38) - *(long *)(lVar6 + 0xd30) >> 3;
    lVar5 = 0;
    local_58 = *(code **)(lVar6 + 0xe8);
    do {
      if (lVar3 == lVar5) {
        if ((*(char *)(context + 4) != '\x01') ||
           (result = ZEHandleLifetimeValidation::zeDeviceGetPrologue
                               (*(ZEHandleLifetimeValidation **)(context + 0xd48),hDriver,pCount,
                                phDevices), result == ZE_RESULT_SUCCESS)) {
          zVar2 = (*local_58)(hDriver,pCount,phDevices);
          lVar6 = 0;
          goto LAB_001486ca;
        }
        break;
      }
      plVar1 = (long *)**(undefined8 **)(*(long *)(context + 0xd30) + lVar5 * 8);
      result = (**(code **)(*plVar1 + 0x90))(plVar1,hDriver,pCount,phDevices);
      lVar5 = lVar5 + 1;
    } while (result == ZE_RESULT_SUCCESS);
  }
  goto LAB_00148702;
  while( true ) {
    plVar1 = (long *)**(undefined8 **)(*(long *)(context + 0xd30) + lVar6 * 8);
    result = (**(code **)(*plVar1 + 0x98))(plVar1,hDriver,pCount,phDevices,zVar2);
    lVar6 = lVar6 + 1;
    if (result != ZE_RESULT_SUCCESS) break;
LAB_001486ca:
    lVar5 = context;
    if (lVar3 == lVar6) {
      result = zVar2;
      if (((zVar2 == ZE_RESULT_SUCCESS) && (*(char *)(context + 4) == '\x01')) &&
         (phDevices != (ze_device_handle_t *)0x0)) {
        for (uVar4 = 0; uVar4 < *pCount; uVar4 = uVar4 + 1) {
          if (phDevices[uVar4] != (ze_device_handle_t)0x0) {
            HandleLifetimeValidation::addHandle
                      (*(HandleLifetimeValidation **)(lVar5 + 0xd48),phDevices[uVar4]);
            HandleLifetimeValidation::addDependent
                      (*(HandleLifetimeValidation **)(lVar5 + 0xd48),hDriver,phDevices[uVar4]);
          }
        }
      }
      break;
    }
  }
LAB_00148702:
  logAndPropagateResult("zeDeviceGet",result);
  return result;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeDeviceGet(
        ze_driver_handle_t hDriver,                     ///< [in] handle of the driver instance
        uint32_t* pCount,                               ///< [in,out] pointer to the number of devices.
                                                        ///< if count is zero, then the driver shall update the value with the
                                                        ///< total number of devices available.
                                                        ///< if count is greater than the number of devices available, then the
                                                        ///< driver shall update the value with the correct number of devices available.
        ze_device_handle_t* phDevices                   ///< [in,out][optional][range(0, *pCount)] array of handle of devices.
                                                        ///< if count is less than the number of devices available, then driver
                                                        ///< shall only retrieve that number of devices.
        )
    {
        context.logger->log_trace("zeDeviceGet(hDriver, pCount, phDevices)");

        auto pfnGet = context.zeDdiTable.Device.pfnGet;

        if( nullptr == pfnGet )
            return logAndPropagateResult("zeDeviceGet", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeDeviceGetPrologue( hDriver, pCount, phDevices );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeDeviceGet", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zeHandleLifetime.zeDeviceGetPrologue( hDriver, pCount, phDevices );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeDeviceGet", result);
        }

        auto driver_result = pfnGet( hDriver, pCount, phDevices );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeDeviceGetEpilogue( hDriver, pCount, phDevices ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeDeviceGet", result);
        }


        if( driver_result == ZE_RESULT_SUCCESS && context.enableHandleLifetime ){
            
            for (size_t i = 0; ( nullptr != phDevices) && (i < *pCount); ++i){
                if (phDevices[i]){
                    context.handleLifetime->addHandle( phDevices[i] );
                    context.handleLifetime->addDependent( hDriver, phDevices[i] );
                }
            }
        }
        return logAndPropagateResult("zeDeviceGet", driver_result);
    }